

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::deleteTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c2);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  if (this->m_rt_img_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_rt_img_id);
    this->m_rt_img_id = 0;
  }
  TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects
            (&this->super_TextureCubeMapArrayTextureSizeRTBase);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::deleteTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GL state */
	gl.activeTexture(GL_TEXTURE2);
	gl.bindTexture(GL_TEXTURE_2D, 0);

	/* Delete GL objects */
	if (m_rt_img_id != 0)
	{
		gl.deleteTextures(1, &m_rt_img_id);
		m_rt_img_id = 0;
	}

	TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects();
}